

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValuesInParamsGenerator<float>::iuValuesInParamsGenerator<float_const*>
          (iuValuesInParamsGenerator<float> *this,float *begin,float *end)

{
  params_t *this_00;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_30;
  const_iterator local_28;
  float *local_20;
  float *end_local;
  float *begin_local;
  iuValuesInParamsGenerator<float> *this_local;
  
  local_20 = end;
  end_local = begin;
  begin_local = (float *)this;
  iuIParamGenerator<float>::iuIParamGenerator(&this->super_iuIParamGenerator<float>);
  (this->super_iuIParamGenerator<float>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_002bf148;
  this_00 = &this->m_values;
  std::vector<float,_std::allocator<float>_>::vector(this_00);
  __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
  __normal_iterator(&this->m_it);
  local_30._M_current = (float *)std::vector<float,_std::allocator<float>_>::end(this_00);
  __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
  __normal_iterator<float*>
            ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)&local_28,
             &local_30);
  std::vector<float,std::allocator<float>>::insert<float_const*,void>
            ((vector<float,std::allocator<float>> *)this_00,local_28,end_local,local_20);
  return;
}

Assistant:

iuValuesInParamsGenerator(Ite begin, Ite end)
    {
        m_values.insert(m_values.end(), begin, end);
    }